

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  bool bVar1;
  reference pdVar2;
  ReusableStringStream *this_00;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  
  rss.m_oss = (ostream *)first._M_current;
  last_local._M_current = (double *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [3])"{ ");
  bVar1 = __gnu_cxx::operator!=
                    (&last_local,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)&rss.m_oss);
  if (bVar1) {
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&last_local);
    stringify<double>(&local_60,pdVar2);
    ReusableStringStream::operator<<((ReusableStringStream *)local_30,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&last_local);
    while (bVar1 = __gnu_cxx::operator!=
                             (&last_local,
                              (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)&rss.m_oss), bVar1) {
      this_00 = ReusableStringStream::operator<<
                          ((ReusableStringStream *)local_30,(char (*) [3])", ");
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&last_local);
      stringify<double>(&local_80,pdVar2);
      ReusableStringStream::operator<<(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&last_local);
    }
  }
  ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [3])" }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }